

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amrex_parser.tab.cpp
# Opt level: O2

int amrex_parserparse(void)

{
  size_t __n;
  AMREX_PARSERSTYPE *__dest;
  short sVar1;
  char *pcVar2;
  AMREX_PARSERSTYPE AVar3;
  int iVar4;
  long lVar5;
  parser_node *ppVar6;
  uint uVar7;
  char *pcVar8;
  parser_node *ppVar9;
  parser_node_t type;
  parser_f2_t ftype;
  char *pcVar10;
  ulong uVar11;
  AMREX_PARSERSTYPE *pAVar12;
  ulong uVar13;
  long lVar14;
  AMREX_PARSERSTYPE *local_750;
  yy_state_t yyssa [200];
  AMREX_PARSERSTYPE yyvsa [200];
  
  amrex_parserchar = -2;
  uVar13 = 0;
  lVar14 = 200;
  pcVar10 = yyssa;
  pAVar12 = yyvsa;
  pcVar8 = pcVar10;
  local_750 = pAVar12;
  do {
    *pcVar10 = (char)uVar13;
    pcVar2 = pcVar8;
    if (pcVar8 + lVar14 + -1 <= pcVar10) {
      if (lVar14 < 10000) {
        lVar14 = lVar14 * 2;
        if (9999 < lVar14) {
          lVar14 = 10000;
        }
        pcVar2 = (char *)malloc(lVar14 * 9 + 7);
        if (pcVar2 != (char *)0x0) {
          lVar5 = (long)pcVar10 - (long)pcVar8;
          __n = lVar5 + 1;
          memcpy(pcVar2,pcVar8,__n);
          __dest = (AMREX_PARSERSTYPE *)(pcVar2 + ((lVar14 + 7) / 8) * 8);
          memcpy(__dest,local_750,__n * 8);
          if (pcVar8 != yyssa) {
            free(pcVar8);
          }
          if ((long)__n < lVar14) {
            pcVar10 = pcVar2 + lVar5;
            pAVar12 = __dest + lVar5;
            local_750 = __dest;
            goto LAB_005d78db;
          }
          iVar4 = 1;
          goto LAB_005d7c3e;
        }
      }
      amrex_parsererror("memory exhausted");
      iVar4 = 2;
      goto LAB_005d7c31;
    }
LAB_005d78db:
    pcVar8 = pcVar2;
    if ((int)uVar13 == 2) {
      iVar4 = 0;
      goto LAB_005d7c31;
    }
    uVar11 = (ulong)(int)uVar13;
    if ((0x242000400008000dU >> (uVar13 & 0x3f) & 1) == 0) {
      sVar1 = yypact[uVar11];
      if (amrex_parserchar == -2) {
        amrex_parserchar = amrex_parserlex();
      }
      if (amrex_parserchar < 1) {
        amrex_parserchar = 0;
        iVar4 = 0;
      }
      else {
        if (amrex_parserchar == 0x100) {
          amrex_parserchar = 0x101;
LAB_005d7c2a:
          iVar4 = 1;
LAB_005d7c31:
          pcVar2 = pcVar8;
          if (pcVar8 != yyssa) {
LAB_005d7c3e:
            free(pcVar2);
          }
          return iVar4;
        }
        iVar4 = 2;
        if ((uint)amrex_parserchar < 0x112) {
          iVar4 = (int)""[(uint)amrex_parserchar];
        }
      }
      uVar7 = sVar1 + iVar4;
      if ((0x112 < uVar7) ||
         (iVar4 != "\b\t\n\x13\f\r\x0e\x0f\x1c\x1c\x1c\n\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !"
                   [uVar7])) goto LAB_005d79b1;
      uVar7 = (uint)"\x10\x11\x12\f\"#$%\r\x0e\x0f\x14\'()*+,-./01234\x02"[uVar7];
      if ((int)uVar7 < 1) {
        iVar4 = -uVar7;
        goto LAB_005d79d1;
      }
      pAVar12[1] = amrex_parserlval;
      amrex_parserchar = -2;
      goto LAB_005d7bb0;
    }
LAB_005d79b1:
    if ((0x1bc0003bf7f4ffe2U >> (uVar11 & 0x3f) & 1) != 0) {
      amrex_parsernerrs = amrex_parsernerrs + 1;
      amrex_parsererror("syntax error");
      goto LAB_005d7c2a;
    }
    iVar4 = (int)"\x02"[uVar11];
LAB_005d79d1:
    lVar5 = (long)""[iVar4];
    AVar3 = pAVar12[1 - lVar5];
    switch(iVar4) {
    case 3:
      amrex::parser_defexpr(pAVar12[-1].n);
      break;
    case 4:
      AVar3.n = amrex::parser_newnumber(pAVar12->d);
      break;
    case 5:
      AVar3.n = amrex::parser_newsymbol(pAVar12->s);
      break;
    case 6:
      ppVar9 = pAVar12[-2].n;
      ppVar6 = pAVar12->n;
      type = PARSER_ADD;
      goto LAB_005d7b0f;
    case 7:
      ppVar9 = pAVar12[-2].n;
      ppVar6 = pAVar12->n;
      type = PARSER_SUB;
      goto LAB_005d7b0f;
    case 8:
      ppVar9 = pAVar12[-2].n;
      ppVar6 = pAVar12->n;
      type = PARSER_MUL;
      goto LAB_005d7b0f;
    case 9:
      ppVar9 = pAVar12[-2].n;
      ppVar6 = pAVar12->n;
      type = PARSER_DIV;
      goto LAB_005d7b0f;
    case 10:
      AVar3 = pAVar12[-1];
      break;
    case 0xb:
      ppVar9 = pAVar12[-2].n;
      ppVar6 = pAVar12->n;
      ftype = PARSER_LT;
      goto LAB_005d7b39;
    case 0xc:
      ppVar9 = pAVar12[-2].n;
      ppVar6 = pAVar12->n;
      ftype = PARSER_GT;
      goto LAB_005d7b39;
    case 0xd:
      ppVar9 = pAVar12[-2].n;
      ppVar6 = pAVar12->n;
      ftype = PARSER_LEQ;
      goto LAB_005d7b39;
    case 0xe:
      ppVar9 = pAVar12[-2].n;
      ppVar6 = pAVar12->n;
      ftype = PARSER_GEQ;
      goto LAB_005d7b39;
    case 0xf:
      ppVar9 = pAVar12[-2].n;
      ppVar6 = pAVar12->n;
      ftype = PARSER_EQ;
      goto LAB_005d7b39;
    case 0x10:
      ppVar9 = pAVar12[-2].n;
      ppVar6 = pAVar12->n;
      ftype = PARSER_NEQ;
      goto LAB_005d7b39;
    case 0x11:
      ppVar9 = pAVar12[-2].n;
      ppVar6 = pAVar12->n;
      ftype = PARSER_AND;
      goto LAB_005d7b39;
    case 0x12:
      ppVar9 = pAVar12[-2].n;
      ppVar6 = pAVar12->n;
      ftype = PARSER_OR;
      goto LAB_005d7b39;
    case 0x13:
      ppVar9 = pAVar12->n;
      type = PARSER_NEG;
      ppVar6 = (parser_node *)0x0;
LAB_005d7b0f:
      AVar3.n = amrex::parser_newnode(type,ppVar9,ppVar6);
      break;
    case 0x14:
      AVar3.n = *(parser_node **)pAVar12;
      break;
    case 0x15:
      ppVar9 = pAVar12[-2].n;
      ppVar6 = pAVar12->n;
      ftype = PARSER_POW;
      goto LAB_005d7b39;
    case 0x16:
      AVar3.n = amrex::parser_newf1(pAVar12[-3].f1,pAVar12[-1].n);
      break;
    case 0x17:
      ftype = pAVar12[-5].f2;
      ppVar9 = pAVar12[-3].n;
      ppVar6 = pAVar12[-1].n;
LAB_005d7b39:
      AVar3.n = amrex::parser_newf2(ftype,ppVar9,ppVar6);
      break;
    case 0x18:
      AVar3.n = amrex::parser_newf3(pAVar12[-7].f3,pAVar12[-5].n,pAVar12[-3].n,pAVar12[-1].n);
      break;
    case 0x19:
      AVar3.n = amrex::parser_newassign(pAVar12[-2].s,pAVar12->n);
      break;
    case 0x1a:
      ppVar9 = pAVar12[-2].n;
      ppVar6 = pAVar12->n;
      goto LAB_005d7be4;
    case 0x1b:
      ppVar9 = pAVar12[-1].n;
      ppVar6 = (parser_node *)0x0;
LAB_005d7be4:
      AVar3.n = amrex::parser_newlist(ppVar9,ppVar6);
    }
    pAVar12 = pAVar12 + -lVar5;
    pcVar10 = pcVar10 + -lVar5;
    pAVar12[1] = AVar3;
    uVar7 = (int)(char)(&DAT_00622dcd)[""[iVar4]] + (int)*pcVar10;
    if (((int)uVar7 < 0) ||
       ("\b\t\n\x13\f\r\x0e\x0f\x1c\x1c\x1c\n\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !"
        [uVar7] != *pcVar10)) {
      pcVar2 = "" + ""[iVar4];
    }
    else {
      pcVar2 = "\x10\x11\x12\f\"#$%\r\x0e\x0f\x14\'()*+,-./01234\x02" + uVar7;
    }
    uVar7 = (uint)*pcVar2;
LAB_005d7bb0:
    uVar13 = (ulong)uVar7;
    pAVar12 = pAVar12 + 1;
    pcVar10 = pcVar10 + 1;
  } while( true );
}

Assistant:

int
yyparse (void)
{
    yy_state_fast_t yystate = 0;
    /* Number of tokens to shift before error messages enabled.  */
    int yyerrstatus = 0;

    /* Refer to the stacks through separate pointers, to allow yyoverflow
       to reallocate them elsewhere.  */

    /* Their size.  */
    YYPTRDIFF_T yystacksize = YYINITDEPTH;

    /* The state stack: array, bottom, top.  */
    yy_state_t yyssa[YYINITDEPTH];
    yy_state_t *yyss = yyssa;
    yy_state_t *yyssp = yyss;

    /* The semantic value stack: array, bottom, top.  */
    YYSTYPE yyvsa[YYINITDEPTH];
    YYSTYPE *yyvs = yyvsa;
    YYSTYPE *yyvsp = yyvs;

  int yyn;
  /* The return value of yyparse.  */
  int yyresult;
  /* Lookahead symbol kind.  */
  yysymbol_kind_t yytoken = YYSYMBOL_YYEMPTY;
  /* The variables used to return semantic value and location from the
     action routines.  */
  YYSTYPE yyval;



#define YYPOPSTACK(N)   (yyvsp -= (N), yyssp -= (N))

  /* The number of symbols on the RHS of the reduced rule.
     Keep to zero when no symbol should be popped.  */
  int yylen = 0;

  YYDPRINTF ((stderr, "Starting parse\n"));

  yychar = AMREX_PARSEREMPTY; /* Cause a token to be read.  */
  goto yysetstate;


/*------------------------------------------------------------.
| yynewstate -- push a new state, which is found in yystate.  |
`------------------------------------------------------------*/
yynewstate:
  /* In all cases, when you get here, the value and location stacks
     have just been pushed.  So pushing a state here evens the stacks.  */
  yyssp++;


/*--------------------------------------------------------------------.
| yysetstate -- set current state (the top of the stack) to yystate.  |
`--------------------------------------------------------------------*/
yysetstate:
  YYDPRINTF ((stderr, "Entering state %d\n", yystate));
  YY_ASSERT (0 <= yystate && yystate < YYNSTATES);
  YY_IGNORE_USELESS_CAST_BEGIN
  *yyssp = YY_CAST (yy_state_t, yystate);
  YY_IGNORE_USELESS_CAST_END
  YY_STACK_PRINT (yyss, yyssp);

  if (yyss + yystacksize - 1 <= yyssp)
#if !defined yyoverflow && !defined YYSTACK_RELOCATE
    goto yyexhaustedlab;
#else
    {
      /* Get the current used size of the three stacks, in elements.  */
      YYPTRDIFF_T yysize = yyssp - yyss + 1;

# if defined yyoverflow
      {
        /* Give user a chance to reallocate the stack.  Use copies of
           these so that the &'s don't force the real ones into
           memory.  */
        yy_state_t *yyss1 = yyss;
        YYSTYPE *yyvs1 = yyvs;

        /* Each stack pointer address is followed by the size of the
           data in use in that stack, in bytes.  This used to be a
           conditional around just the two extra args, but that might
           be undefined if yyoverflow is a macro.  */
        yyoverflow (YY_("memory exhausted"),
                    &yyss1, yysize * YYSIZEOF (*yyssp),
                    &yyvs1, yysize * YYSIZEOF (*yyvsp),
                    &yystacksize);
        yyss = yyss1;
        yyvs = yyvs1;
      }
# else /* defined YYSTACK_RELOCATE */
      /* Extend the stack our own way.  */
      if (YYMAXDEPTH <= yystacksize)
        goto yyexhaustedlab;
      yystacksize *= 2;
      if (YYMAXDEPTH < yystacksize)
        yystacksize = YYMAXDEPTH;

      {
        yy_state_t *yyss1 = yyss;
        union yyalloc *yyptr =
          YY_CAST (union yyalloc *,
                   YYSTACK_ALLOC (YY_CAST (YYSIZE_T, YYSTACK_BYTES (yystacksize))));
        if (! yyptr)
          goto yyexhaustedlab;
        YYSTACK_RELOCATE (yyss_alloc, yyss);
        YYSTACK_RELOCATE (yyvs_alloc, yyvs);
#  undef YYSTACK_RELOCATE
        if (yyss1 != yyssa)
          YYSTACK_FREE (yyss1);
      }
# endif

      yyssp = yyss + yysize - 1;
      yyvsp = yyvs + yysize - 1;

      YY_IGNORE_USELESS_CAST_BEGIN
      YYDPRINTF ((stderr, "Stack size increased to %ld\n",
                  YY_CAST (long, yystacksize)));
      YY_IGNORE_USELESS_CAST_END

      if (yyss + yystacksize - 1 <= yyssp)
        YYABORT;
    }
#endif /* !defined yyoverflow && !defined YYSTACK_RELOCATE */

  if (yystate == YYFINAL)
    YYACCEPT;

  goto yybackup;


/*-----------.
| yybackup.  |
`-----------*/
yybackup:
  /* Do appropriate processing given the current state.  Read a
     lookahead token if we need one and don't already have one.  */

  /* First try to decide what to do without reference to lookahead token.  */
  yyn = yypact[yystate];
  if (yypact_value_is_default (yyn))
    goto yydefault;

  /* Not known => get a lookahead token if don't already have one.  */

  /* YYCHAR is either empty, or end-of-input, or a valid lookahead.  */
  if (yychar == AMREX_PARSEREMPTY)
    {
      YYDPRINTF ((stderr, "Reading a token\n"));
      yychar = yylex ();
    }

  if (yychar <= AMREX_PARSEREOF)
    {
      yychar = AMREX_PARSEREOF;
      yytoken = YYSYMBOL_YYEOF;
      YYDPRINTF ((stderr, "Now at end of input.\n"));
    }
  else if (yychar == AMREX_PARSERerror)
    {
      /* The scanner already issued an error message, process directly
         to error recovery.  But do not keep the error token as
         lookahead, it is too special and may lead us to an endless
         loop in error recovery. */
      yychar = AMREX_PARSERUNDEF;
      yytoken = YYSYMBOL_YYerror;
      goto yyerrlab1;
    }
  else
    {
      yytoken = YYTRANSLATE (yychar);
      YY_SYMBOL_PRINT ("Next token is", yytoken, &yylval, &yylloc);
    }

  /* If the proper action on seeing token YYTOKEN is to reduce or to
     detect an error, take that action.  */
  yyn += yytoken;
  if (yyn < 0 || YYLAST < yyn || yycheck[yyn] != yytoken)
    goto yydefault;
  yyn = yytable[yyn];
  if (yyn <= 0)
    {
      if (yytable_value_is_error (yyn))
        goto yyerrlab;
      yyn = -yyn;
      goto yyreduce;
    }

  /* Count tokens shifted since error; after three, turn off error
     status.  */
  if (yyerrstatus)
    yyerrstatus--;

  /* Shift the lookahead token.  */
  YY_SYMBOL_PRINT ("Shifting", yytoken, &yylval, &yylloc);
  yystate = yyn;
  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END

  /* Discard the shifted token.  */
  yychar = AMREX_PARSEREMPTY;
  goto yynewstate;


/*-----------------------------------------------------------.
| yydefault -- do the default action for the current state.  |
`-----------------------------------------------------------*/
yydefault:
  yyn = yydefact[yystate];
  if (yyn == 0)
    goto yyerrlab;
  goto yyreduce;


/*-----------------------------.
| yyreduce -- do a reduction.  |
`-----------------------------*/
yyreduce:
  /* yyn is the number of a rule to reduce with.  */
  yylen = yyr2[yyn];

  /* If YYLEN is nonzero, implement the default value of the action:
     '$$ = $1'.

     Otherwise, the following line sets YYVAL to garbage.
     This behavior is undocumented and Bison
     users should not rely upon it.  Assigning to YYVAL
     unconditionally makes the parser a bit smaller, and it avoids a
     GCC warning that YYVAL may be used uninitialized.  */
  yyval = yyvsp[1-yylen];


  YY_REDUCE_PRINT (yyn);
  switch (yyn)
    {
  case 3: /* input: input exp EOL  */
                {
    amrex::parser_defexpr((yyvsp[-1].n));
  }
    break;

  case 4: /* exp: NUMBER  */
                             { (yyval.n) = amrex::parser_newnumber((yyvsp[0].d)); }
    break;

  case 5: /* exp: SYMBOL  */
                             { (yyval.n) = amrex::parser_newsymbol((yyvsp[0].s)); }
    break;

  case 6: /* exp: exp '+' exp  */
                             { (yyval.n) = amrex::parser_newnode(amrex::PARSER_ADD, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 7: /* exp: exp '-' exp  */
                             { (yyval.n) = amrex::parser_newnode(amrex::PARSER_SUB, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 8: /* exp: exp '*' exp  */
                             { (yyval.n) = amrex::parser_newnode(amrex::PARSER_MUL, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 9: /* exp: exp '/' exp  */
                             { (yyval.n) = amrex::parser_newnode(amrex::PARSER_DIV, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 10: /* exp: '(' exp ')'  */
                             { (yyval.n) = (yyvsp[-1].n); }
    break;

  case 11: /* exp: exp '<' exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_LT, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 12: /* exp: exp '>' exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_GT, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 13: /* exp: exp "<=" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_LEQ, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 14: /* exp: exp ">=" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_GEQ, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 15: /* exp: exp "==" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_EQ, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 16: /* exp: exp "!=" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_NEQ, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 17: /* exp: exp "and" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_AND, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 18: /* exp: exp "or" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_OR, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 19: /* exp: '-' exp  */
                             { (yyval.n) = amrex::parser_newnode(amrex::PARSER_NEG, (yyvsp[0].n), nullptr); }
    break;

  case 20: /* exp: '+' exp  */
                             { (yyval.n) = (yyvsp[0].n); }
    break;

  case 21: /* exp: exp "**" exp  */
                             { (yyval.n) = amrex::parser_newf2(amrex::PARSER_POW, (yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 22: /* exp: F1 '(' exp ')'  */
                             { (yyval.n) = amrex::parser_newf1((yyvsp[-3].f1), (yyvsp[-1].n)); }
    break;

  case 23: /* exp: F2 '(' exp ',' exp ')'  */
                             { (yyval.n) = amrex::parser_newf2((yyvsp[-5].f2), (yyvsp[-3].n), (yyvsp[-1].n)); }
    break;

  case 24: /* exp: F3 '(' exp ',' exp ',' exp ')'  */
                                 { (yyval.n) = amrex::parser_newf3((yyvsp[-7].f3), (yyvsp[-5].n), (yyvsp[-3].n), (yyvsp[-1].n)); }
    break;

  case 25: /* exp: SYMBOL '=' exp  */
                             { (yyval.n) = amrex::parser_newassign((yyvsp[-2].s), (yyvsp[0].n)); }
    break;

  case 26: /* exp: exp ';' exp  */
                             { (yyval.n) = amrex::parser_newlist((yyvsp[-2].n), (yyvsp[0].n)); }
    break;

  case 27: /* exp: exp ';'  */
                             { (yyval.n) = amrex::parser_newlist((yyvsp[-1].n), nullptr); }
    break;



      default: break;
    }
  /* User semantic actions sometimes alter yychar, and that requires
     that yytoken be updated with the new translation.  We take the
     approach of translating immediately before every use of yytoken.
     One alternative is translating here after every semantic action,
     but that translation would be missed if the semantic action invokes
     YYABORT, YYACCEPT, or YYERROR immediately after altering yychar or
     if it invokes YYBACKUP.  In the case of YYABORT or YYACCEPT, an
     incorrect destructor might then be invoked immediately.  In the
     case of YYERROR or YYBACKUP, subsequent parser actions might lead
     to an incorrect destructor call or verbose syntax error message
     before the lookahead is translated.  */
  YY_SYMBOL_PRINT ("-> $$ =", YY_CAST (yysymbol_kind_t, yyr1[yyn]), &yyval, &yyloc);

  YYPOPSTACK (yylen);
  yylen = 0;

  *++yyvsp = yyval;

  /* Now 'shift' the result of the reduction.  Determine what state
     that goes to, based on the state we popped back to and the rule
     number reduced by.  */
  {
    const int yylhs = yyr1[yyn] - YYNTOKENS;
    const int yyi = yypgoto[yylhs] + *yyssp;
    yystate = (0 <= yyi && yyi <= YYLAST && yycheck[yyi] == *yyssp
               ? yytable[yyi]
               : yydefgoto[yylhs]);
  }

  goto yynewstate;


/*--------------------------------------.
| yyerrlab -- here on detecting error.  |
`--------------------------------------*/
yyerrlab:
  /* Make sure we have latest lookahead translation.  See comments at
     user semantic actions for why this is necessary.  */
  yytoken = yychar == AMREX_PARSEREMPTY ? YYSYMBOL_YYEMPTY : YYTRANSLATE (yychar);
  /* If not already recovering from an error, report this error.  */
  if (!yyerrstatus)
    {
      ++yynerrs;
      yyerror (YY_("syntax error"));
    }

  if (yyerrstatus == 3)
    {
      /* If just tried and failed to reuse lookahead token after an
         error, discard it.  */

      if (yychar <= AMREX_PARSEREOF)
        {
          /* Return failure if at end of input.  */
          if (yychar == AMREX_PARSEREOF)
            YYABORT;
        }
      else
        {
          yydestruct ("Error: discarding",
                      yytoken, &yylval);
          yychar = AMREX_PARSEREMPTY;
        }
    }

  /* Else will try to reuse lookahead token after shifting the error
     token.  */
  goto yyerrlab1;


/*---------------------------------------------------.
| yyerrorlab -- error raised explicitly by YYERROR.  |
`---------------------------------------------------*/
yyerrorlab:
  /* Pacify compilers when the user code never invokes YYERROR and the
     label yyerrorlab therefore never appears in user code.  */
  if (0)
    YYERROR;

  /* Do not reclaim the symbols of the rule whose action triggered
     this YYERROR.  */
  YYPOPSTACK (yylen);
  yylen = 0;
  YY_STACK_PRINT (yyss, yyssp);
  yystate = *yyssp;
  goto yyerrlab1;


/*-------------------------------------------------------------.
| yyerrlab1 -- common code for both syntax error and YYERROR.  |
`-------------------------------------------------------------*/
yyerrlab1:
  yyerrstatus = 3;      /* Each real token shifted decrements this.  */

  /* Pop stack until we find a state that shifts the error token.  */
  for (;;)
    {
      yyn = yypact[yystate];
      if (!yypact_value_is_default (yyn))
        {
          yyn += YYSYMBOL_YYerror;
          if (0 <= yyn && yyn <= YYLAST && yycheck[yyn] == YYSYMBOL_YYerror)
            {
              yyn = yytable[yyn];
              if (0 < yyn)
                break;
            }
        }

      /* Pop the current state because it cannot handle the error token.  */
      if (yyssp == yyss)
        YYABORT;


      yydestruct ("Error: popping",
                  YY_ACCESSING_SYMBOL (yystate), yyvsp);
      YYPOPSTACK (1);
      yystate = *yyssp;
      YY_STACK_PRINT (yyss, yyssp);
    }

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END


  /* Shift the error token.  */
  YY_SYMBOL_PRINT ("Shifting", YY_ACCESSING_SYMBOL (yyn), yyvsp, yylsp);

  yystate = yyn;
  goto yynewstate;


/*-------------------------------------.
| yyacceptlab -- YYACCEPT comes here.  |
`-------------------------------------*/
yyacceptlab:
  yyresult = 0;
  goto yyreturn;


/*-----------------------------------.
| yyabortlab -- YYABORT comes here.  |
`-----------------------------------*/
yyabortlab:
  yyresult = 1;
  goto yyreturn;


#if !defined yyoverflow
/*-------------------------------------------------.
| yyexhaustedlab -- memory exhaustion comes here.  |
`-------------------------------------------------*/
yyexhaustedlab:
  yyerror (YY_("memory exhausted"));
  yyresult = 2;
  goto yyreturn;
#endif


/*-------------------------------------------------------.
| yyreturn -- parsing is finished, clean up and return.  |
`-------------------------------------------------------*/
yyreturn:
  if (yychar != AMREX_PARSEREMPTY)
    {
      /* Make sure we have latest lookahead translation.  See comments at
         user semantic actions for why this is necessary.  */
      yytoken = YYTRANSLATE (yychar);
      yydestruct ("Cleanup: discarding lookahead",
                  yytoken, &yylval);
    }
  /* Do not reclaim the symbols of the rule whose action triggered
     this YYABORT or YYACCEPT.  */
  YYPOPSTACK (yylen);
  YY_STACK_PRINT (yyss, yyssp);
  while (yyssp != yyss)
    {
      yydestruct ("Cleanup: popping",
                  YY_ACCESSING_SYMBOL (+*yyssp), yyvsp);
      YYPOPSTACK (1);
    }
#ifndef yyoverflow
  if (yyss != yyssa)
    YYSTACK_FREE (yyss);
#endif

  return yyresult;
}